

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_glows.cxx
# Opt level: O3

void __thiscall
xray_re::xr_level_glows::load(xr_level_glows *this,uint32_t xrlc_version,xr_reader *r)

{
  xr_reader *local_20;
  
  if (xrlc_version < 10) {
    local_20 = xr_reader::open_chunk(r,(xrlc_version == 5) + 9);
    if (local_20 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_glows.cxx"
                    ,0x32,"void xray_re::xr_level_glows::load(uint32_t, xr_reader &)");
    }
  }
  else {
    local_20 = xr_reader::open_chunk(r,7);
    if ((xrlc_version & 0xfffffffe) != 10) {
      if (local_20 == (xr_reader *)0x0) {
        __assert_fail("s",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_glows.cxx"
                      ,0x3a,"void xray_re::xr_level_glows::load(uint32_t, xr_reader &)");
      }
      load_v13(this,local_20);
      goto LAB_0016ad6c;
    }
    if (local_20 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_glows.cxx"
                    ,0x36,"void xray_re::xr_level_glows::load(uint32_t, xr_reader &)");
    }
  }
  load_v5(this,local_20);
LAB_0016ad6c:
  xr_reader::close_chunk(r,&local_20);
  return;
}

Assistant:

void xr_level_glows::load(uint32_t xrlc_version, xr_reader& r)
{
	xr_reader* s = 0;
	if (xrlc_version <= XRLC_VERSION_9) {
		if (xrlc_version == XRLC_VERSION_5)
			s = r.open_chunk(FSL5_GLOWS);
		else
			s = r.open_chunk(FSL8_GLOWS);
		xr_assert(s);
		load_v5(*s);
	} else if (xrlc_version == XRLC_VERSION_10 || xrlc_version == XRLC_VERSION_11) {
		s = r.open_chunk(FSL10_GLOWS);
		xr_assert(s);
		load_v5(*s);
	} else {
		s = r.open_chunk(FSL13_GLOWS);
		xr_assert(s);
		load_v13(*s);
	}
	r.close_chunk(s);
}